

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strrpos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxi32 sVar2;
  char *pcVar3;
  char *pPattern;
  int iVar4;
  long lVar5;
  sxu32 nLen_00;
  char *pcVar6;
  int nLen;
  sxu32 nOfft;
  int nPatLen;
  jx9_context *local_38;
  
  if (nArg < 2) goto LAB_0012bd6f;
  pcVar3 = jx9_value_to_string(*apArg,&nLen);
  pPattern = jx9_value_to_string(apArg[1],&nPatLen);
  iVar4 = nLen;
  nOfft = 0;
  pcVar6 = pcVar3;
  if (nArg != 2) {
    uVar1 = jx9_value_to_int(apArg[2]);
    if ((int)uVar1 < 0) {
      if (nLen == -uVar1 || SBORROW4(nLen,-uVar1) != (int)(nLen + uVar1) < 0) goto LAB_0012bd6f;
      iVar4 = nLen + uVar1;
      nLen = iVar4;
    }
    else {
      if (nLen - uVar1 == 0 || nLen < (int)uVar1) goto LAB_0012bd6f;
      pcVar6 = pcVar3 + uVar1;
      nLen = nLen - uVar1;
    }
  }
  if ((0 < nLen) && (0 < nPatLen)) {
    pcVar3 = pcVar3 + iVar4;
    lVar5 = -(long)iVar4;
    nLen_00 = 1;
    local_38 = pCtx;
    while (pcVar3 = pcVar3 + -1, pCtx = local_38, pcVar6 < pcVar3) {
      sVar2 = SyBlobSearch(pcVar3,nLen_00,pPattern,nPatLen,&nOfft);
      lVar5 = lVar5 + 1;
      nLen_00 = nLen_00 + 1;
      if (sVar2 == 0) {
        jx9_result_int64(local_38,(ulong)nOfft - lVar5);
        return 0;
      }
    }
  }
LAB_0012bd6f:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strrpos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStart, *zBlob, *zPattern, *zPtr, *zEnd;
	ProcStringMatch xPatternMatch = SyBlobSearch; /* Case-sensitive pattern match */
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	/* Point to the end of the pattern */
	zPtr = &zBlob[nLen - 1];
	zEnd = &zBlob[nLen];
	/* Save the starting posistion */
	zStart = zBlob;
	nOfft = 0; /* cc warning */
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		int nStart;
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				nLen -= nStart;
				zPtr = &zBlob[nLen - 1];
				zEnd = &zBlob[nLen];
			}
		}else{
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				zBlob += nStart;
				nLen -= nStart;
			}
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		for(;;){
			if( zBlob >= zPtr ){
				break;
			}
			rc = xPatternMatch((const void *)zPtr, (sxu32)(zEnd-zPtr), (const void *)zPattern, (sxu32)nPatLen, &nOfft);
			if( rc == SXRET_OK ){
				/* Pattern found, return it's position */
				jx9_result_int64(pCtx, (jx9_int64)(&zPtr[nOfft] - zStart));
				return JX9_OK;
			}
			zPtr--;
		}
		/* Pattern not found, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}